

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::TLVWriter::TLVWriter(TLVWriter *this,byte_t *p,ui32_t c,IPrimerLookup *PrimerLookup)

{
  IPrimerLookup *PrimerLookup_local;
  ui32_t c_local;
  byte_t *p_local;
  TLVWriter *this_local;
  
  Kumu::MemIOWriter::MemIOWriter(&this->super_MemIOWriter,p,c);
  std::
  map<ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::map(&this->m_ElementMap);
  this->m_Lookup = PrimerLookup;
  if (3 < c) {
    return;
  }
  __assert_fail("c > 3",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXFTypes.cpp"
                ,0x24d,"ASDCP::MXF::TLVWriter::TLVWriter(byte_t *, ui32_t, IPrimerLookup *)");
}

Assistant:

ASDCP::MXF::TLVWriter::TLVWriter(byte_t* p, ui32_t c, IPrimerLookup* PrimerLookup) :
  MemIOWriter(p, c), m_Lookup(PrimerLookup)
{
  assert(c > 3);
}